

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t rar5_read_header(archive_read *a,archive_entry *entry)

{
  int *piVar1;
  long lVar2;
  wchar_t wVar3;
  size_t i;
  int *piVar4;
  long lVar5;
  void *pvVar6;
  int64_t iVar7;
  long request;
  long request_00;
  ulong min;
  bool bVar8;
  char signature [8];
  long local_40;
  long local_38;
  
  piVar1 = (int *)a->format->data;
  if (*piVar1 == 0) {
    (a->archive).archive_format = 0x100000;
    (a->archive).archive_format_name = "RAR5";
    bVar8 = false;
    piVar4 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
    if (piVar4 == (int *)0x0) {
      wVar3 = L'\x01';
    }
    else {
      if (((char)*piVar4 == 'M') && (*(char *)((long)piVar4 + 1) == 'Z')) {
LAB_00154154:
        lVar5 = 0;
        do {
          *(byte *)((long)&local_38 + lVar5) = rar5_signature_xor[lVar5] ^ 0xa1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 8);
        min = 0x1000;
        lVar5 = 0;
LAB_00154179:
        while( true ) {
          if (0x80000 < min + lVar5) goto LAB_00154224;
          pvVar6 = __archive_read_ahead(a,min,&local_40);
          if (pvVar6 != (void *)0x0) break;
          bVar8 = min < 0x80;
          min = min >> 1;
          if (bVar8) goto LAB_001541f9;
        }
        if (0x3f < local_40) {
          request = 0;
LAB_001541c6:
          if (*(long *)((long)pvVar6 + request) != local_38) goto code_r0x001541d1;
          __archive_read_consume(a,request);
LAB_00154224:
          bVar8 = false;
          wVar3 = L'\0';
          goto LAB_00154229;
        }
LAB_001541f9:
        archive_set_error(&a->archive,0x54,"Couldn\'t find out RAR header");
        wVar3 = L'\xffffffe2';
        bVar8 = true;
        goto LAB_00154229;
      }
      bVar8 = false;
      wVar3 = L'\0';
      if (*piVar4 == 0x464c457f) goto LAB_00154154;
    }
LAB_00154229:
    if (bVar8) {
      return wVar3;
    }
    *piVar1 = 1;
  }
  if (piVar1[1] == 0) {
    iVar7 = __archive_read_consume(a,8);
    if (iVar7 != 8) {
      return L'\x01';
    }
    piVar1[1] = 1;
  }
  do {
    do {
      wVar3 = process_base_block(a,entry);
    } while (wVar3 == L'\xfffffff6');
  } while ((wVar3 == L'\0') && ((*(byte *)(piVar1 + 0xb) & 4) != 0));
  return wVar3;
code_r0x001541d1:
  request_00 = request + 0x10;
  lVar2 = request + 0x18;
  request = request_00;
  if ((ulong)(local_40 + (long)pvVar6) <= (ulong)((long)pvVar6 + lVar2)) goto code_r0x001541e2;
  goto LAB_001541c6;
code_r0x001541e2:
  __archive_read_consume(a,request_00);
  lVar5 = lVar5 + request_00;
  goto LAB_00154179;
}

Assistant:

static int rar5_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct rar5* rar = get_context(a);
	int ret;

	if(rar->header_initialized == 0) {
		init_header(a);
		if ((ret = try_skip_sfx(a)) < ARCHIVE_WARN)
			return ret;
		rar->header_initialized = 1;
	}

	if(rar->skipped_magic == 0) {
		if(ARCHIVE_OK != consume(a, sizeof(rar5_signature_xor))) {
			return ARCHIVE_EOF;
		}

		rar->skipped_magic = 1;
	}

	do {
		ret = process_base_block(a, entry);
	} while(ret == ARCHIVE_RETRY ||
			(rar->main.endarc > 0 && ret == ARCHIVE_OK));

	return ret;
}